

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeSampledImageType(Builder *this,Id imageType)

{
  pointer ppIVar1;
  Id IVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  Instruction *local_28;
  
  ppIVar1 = this->groupedTypes[0x1b].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)this->groupedTypes[0x1b].
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3;
  uVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  do {
    if (uVar4 == uVar5) {
      local_28 = (Instruction *)dxil_spv::allocate_in_thread(0x38);
      IVar2 = this->uniqueId + 1;
      this->uniqueId = IVar2;
      local_28->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
      local_28->resultId = IVar2;
      local_28->typeId = 0;
      local_28->opCode = OpTypeSampledImage;
      (local_28->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_28->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_28->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_28->block = (Block *)0x0;
      Instruction::addIdOperand(local_28,imageType);
      std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
      push_back(this->groupedTypes + 0x1b,&local_28);
      local_30._M_head_impl = local_28;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)&this->constantsTypesGlobals,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
      if (local_30._M_head_impl != (Instruction *)0x0) {
        (*(local_30._M_head_impl)->_vptr_Instruction[1])();
      }
      Module::mapInstruction(&this->module,local_28);
      break;
    }
    local_28 = ppIVar1[uVar5];
    uVar5 = uVar5 + 1;
  } while (*(local_28->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != imageType);
  return local_28->resultId;
}

Assistant:

Id Builder::makeSampledImageType(Id imageType)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeSampledImage].size(); ++t) {
        type = groupedTypes[OpTypeSampledImage][t];
        if (type->getIdOperand(0) == imageType)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeSampledImage);
    type->addIdOperand(imageType);

    groupedTypes[OpTypeSampledImage].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}